

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<tcu::Matrix<double,_2,_3>,_tcu::Matrix<double,_3,_2>_>::call
          (unary<tcu::Matrix<double,_2,_3>,_tcu::Matrix<double,_3,_2>_> *this,GLvoid *result_dst,
          GLvoid *argument_src)

{
  bool bVar1;
  int row;
  undefined8 *puVar2;
  GLdouble *data;
  long lVar3;
  long lVar4;
  undefined8 *puVar5;
  undefined1 auVar6 [16];
  bool bVar8;
  undefined8 uVar9;
  Matrix<double,_3,_2> arg;
  Matrix<double,_2,_3> result;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined8 local_88 [13];
  long lVar7;
  
  local_88[4] = 0;
  local_88[5] = 0;
  local_88[2] = 0;
  local_88[3] = 0;
  local_88[0] = 0;
  local_88[1] = 0;
  lVar3 = 0;
  puVar2 = local_88;
  bVar8 = true;
  do {
    bVar1 = bVar8;
    lVar4 = 0;
    auVar6 = _DAT_019f34d0;
    do {
      bVar8 = SUB164(auVar6 ^ _DAT_019ec5b0,4) == DAT_01a3c1d0._4_4_ &&
              SUB164(auVar6 ^ _DAT_019ec5b0,0) < DAT_01a3c1d0;
      if (bVar8) {
        uVar9 = 0x3ff0000000000000;
        if (lVar3 * 0x10 != lVar4) {
          uVar9 = 0;
        }
        *(undefined8 *)((long)puVar2 + lVar4) = uVar9;
      }
      if (bVar8) {
        uVar9 = 0x3ff0000000000000;
        if (lVar3 * 0x10 + -0x10 != lVar4) {
          uVar9 = 0;
        }
        *(undefined8 *)((long)puVar2 + lVar4 + 0x10) = uVar9;
      }
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0x40);
    lVar3 = 1;
    puVar2 = local_88 + 1;
    bVar8 = false;
  } while (bVar1);
  lVar3 = 0;
  do {
    uVar9 = 0x3ff0000000000000;
    if (lVar3 != 0) {
      uVar9 = 0;
    }
    *(undefined8 *)(local_b8 + lVar3 * 8) = uVar9;
    uVar9 = 0x3ff0000000000000;
    if (lVar3 != 1) {
      uVar9 = 0;
    }
    *(undefined8 *)(local_a8 + lVar3 * 8 + 8) = uVar9;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_b8 = *argument_src;
  local_a8 = *(undefined1 (*) [16])((long)argument_src + 0x10);
  local_98 = *(undefined1 (*) [16])((long)argument_src + 0x20);
  (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(local_88 + 7);
  puVar2 = local_88;
  puVar5 = local_88 + 7;
  bVar8 = true;
  do {
    bVar1 = bVar8;
    lVar3 = 0;
    do {
      *(undefined8 *)((long)puVar2 + lVar3) = *(undefined8 *)((long)puVar5 + lVar3);
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x30);
    puVar2 = local_88 + 1;
    puVar5 = local_88 + 8;
    bVar8 = false;
  } while (bVar1);
  lVar3 = 0;
  do {
    uVar9 = *(undefined8 *)((long)local_88 + lVar3 + 8);
    *(undefined8 *)((long)result_dst + lVar3) = *(undefined8 *)((long)local_88 + lVar3);
    ((undefined8 *)((long)result_dst + lVar3))[1] = uVar9;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x30);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}